

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PointInstancer *instancer,uint32_t indent,
          bool closing_brace)

{
  optional<tinyusdz::Interpolation> oVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t uVar6;
  undefined7 in_register_00000081;
  uint32_t in_R9D;
  uint indent_00;
  stringstream ss;
  string local_218;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [48];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar6 = (uint32_t)CONCAT71(in_register_00000081,closing_brace);
  local_1d8._12_4_ = indent;
  local_1d8._16_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1d8 + 0x20));
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)instancer & 0xffffffff),n);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  to_string_abi_cxx11_((string *)local_1f8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_1f8._0_8_,local_1f8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," PointInstancer \"",0x11);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  oVar1 = (optional<tinyusdz::Interpolation>)((long)local_1f8 + 0x10);
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  uVar5 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)instancer & 0xffffffff),n_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_
              (&local_218,this + 0x1a10,(PrimMeta *)(ulong)((int)instancer + 1),indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    uVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)instancer & 0xffffffff),uVar5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    uVar5 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_02;
    }
  }
  local_1d8._0_8_ = (ulong)instancer & 0xffffffff;
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)instancer & 0xffffffff),uVar5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (this[0x1e68] == (tinyusdz)0x1) {
    local_1d8._28_4_ = *(undefined4 *)(this + 0x1f60);
    local_1f8._0_8_ = oVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"prototypes","");
    uVar6 = (int)local_1d8._0_8_ + 1;
    anon_unknown_173::print_relationship
              (&local_218,(Relationship *)(this + 0x1e70),(ListEditQual *)(local_1d8 + 0x1c),
               SUB81((string *)local_1f8,0),(string *)(ulong)uVar6,in_R9D);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"protoIndices","");
  indent_00 = (int)local_1d8._0_8_ + 1;
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_218,this + 0x2178,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ids","");
  print_typed_attr<std::vector<long,std::allocator<long>>>
            (&local_218,this + 0x23f0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
             local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"invisibleIds","");
  print_typed_attr<std::vector<long,std::allocator<long>>>
            (&local_218,this + 0x3538,
             (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
             local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"positions","");
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            (&local_218,this + 0x2668,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"orientations","");
  print_typed_attr<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
            (&local_218,this + 0x28e0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
              *)local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"scales","");
  print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
            (&local_218,this + 0x2b58,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              *)local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"velocities","");
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_218,this + 0x2dd0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"accelerations","");
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_218,this + 0x3048,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = oVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"angularVelocities","");
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_218,this + 0x32c0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1f8,(string *)(ulong)indent_00,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f8._0_8_ != oVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  print_gprim_predefined<tinyusdz::PointInstancer>(&local_218,(PointInstancer *)this,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_218,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  uVar6 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_EDX_04;
  }
  if (local_1d8[0xc] != '\0') {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)local_1d8._0_8_,uVar6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = local_1d8._16_8_;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d8 + 0x20));
  std::ios_base::~ios_base(local_138);
  return (string *)uVar2;
}

Assistant:

std::string to_string(const PointInstancer &instancer, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(instancer.spec)
     << " PointInstancer \"" << instancer.name << "\"\n";
  if (instancer.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(instancer.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  if (instancer.prototypes) {
    ss << print_relationship(instancer.prototypes.value(),
                             instancer.prototypes.value().get_listedit_qual(),
                             /* custom */ false, "prototypes", indent + 1);
  }
  ss << print_typed_attr(instancer.protoIndices, "protoIndices", indent + 1);
  ss << print_typed_attr(instancer.ids, "ids", indent + 1);
  ss << print_typed_attr(instancer.invisibleIds, "invisibleIds", indent + 1);
  ss << print_typed_attr(instancer.positions, "positions", indent + 1);
  ss << print_typed_attr(instancer.orientations, "orientations", indent + 1);
  ss << print_typed_attr(instancer.scales, "scales", indent + 1);
  ss << print_typed_attr(instancer.velocities, "velocities", indent + 1);
  ss << print_typed_attr(instancer.accelerations, "accelerations", indent + 1);
  ss << print_typed_attr(instancer.angularVelocities, "angularVelocities",
                         indent + 1);

  ss << print_gprim_predefined(instancer, indent + 1);

  ss << print_props(instancer.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}